

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteConstVector(BinaryWriterSpec *this,ConstVector *consts)

{
  Const *pCVar1;
  const_reference const__00;
  size_type sVar2;
  Const *const_;
  size_t i;
  ConstVector *consts_local;
  BinaryWriterSpec *this_local;
  
  Stream::Writef(this->json_stream_,"[");
  const_ = (Const *)0x0;
  while( true ) {
    pCVar1 = (Const *)std::vector<wabt::Const,_std::allocator<wabt::Const>_>::size(consts);
    if (pCVar1 <= const_) break;
    const__00 = std::vector<wabt::Const,_std::allocator<wabt::Const>_>::operator[]
                          (consts,(size_type)const_);
    WriteConst(this,const__00);
    sVar2 = std::vector<wabt::Const,_std::allocator<wabt::Const>_>::size(consts);
    if (const_ != (Const *)(sVar2 - 1)) {
      WriteSeparator(this);
    }
    const_ = (Const *)((long)&(const_->loc).filename._M_len + 1);
  }
  Stream::Writef(this->json_stream_,"]");
  return;
}

Assistant:

void BinaryWriterSpec::WriteConstVector(const ConstVector& consts) {
  json_stream_->Writef("[");
  for (size_t i = 0; i < consts.size(); ++i) {
    const Const& const_ = consts[i];
    WriteConst(const_);
    if (i != consts.size() - 1) {
      WriteSeparator();
    }
  }
  json_stream_->Writef("]");
}